

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_streaming_listener.hpp
# Opt level: O0

TestEventListener * iutest::StreamResultListener::SetUp(void)

{
  StateVariable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  ulong uVar2;
  StreamResultListener *this_00;
  char *host;
  char *port;
  UnitTest *this_01;
  TestEventListeners *this_02;
  string local_98 [32];
  string local_78 [48];
  StreamResultListener *local_48;
  TestEventListener *p;
  size_t pos;
  string local_30 [8];
  string addr;
  
  this = TestEnv::get_stream_result_to_abi_cxx11_();
  pbVar1 = TestEnv::StateVariable::operator_cast_to_string_((StateVariable *)this);
  std::__cxx11::string::string(local_30,(string *)pbVar1);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    p = (TestEventListener *)std::__cxx11::string::find((char)local_30,0x3a);
    if (p == (TestEventListener *)0xffffffffffffffff) {
      addr.field_2._8_8_ = 0;
    }
    else {
      this_00 = (StreamResultListener *)operator_new(0x18);
      std::__cxx11::string::substr((ulong)local_78,(ulong)local_30);
      host = (char *)std::__cxx11::string::c_str();
      std::__cxx11::string::substr((ulong)local_98,(ulong)local_30);
      port = (char *)std::__cxx11::string::c_str();
      StreamResultListener(this_00,host,port);
      std::__cxx11::string::~string(local_98);
      std::__cxx11::string::~string(local_78);
      local_48 = this_00;
      this_01 = UnitTest::GetInstance();
      this_02 = UnitTest::listeners(this_01);
      TestEventListeners::Append(this_02,(TestEventListener *)local_48);
      addr.field_2._8_8_ = local_48;
    }
  }
  else {
    addr.field_2._8_8_ = 0;
  }
  pos._4_4_ = 1;
  std::__cxx11::string::~string(local_30);
  return (TestEventListener *)addr.field_2._8_8_;
}

Assistant:

static TestEventListener* SetUp()
    {
        ::std::string addr = TestEnv::get_stream_result_to();
        if( addr.empty() )
        {
            return NULL;
        }
        const size_t pos = addr.find(':');
        if( pos == ::std::string::npos )
        {
            return NULL;
        }
        TestEventListener* p = new StreamResultListener(addr.substr(0, pos).c_str(), addr.substr(pos+1).c_str());
        UnitTest::GetInstance()->listeners().Append(p);
        return p;
    }